

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroller.cpp
# Opt level: O0

void __thiscall
QtMWidgets::ScrollerPrivate::ScrollerPrivate(ScrollerPrivate *this,Scroller *parent,QObject *t)

{
  QObject *t_local;
  Scroller *parent_local;
  ScrollerPrivate *this_local;
  
  this->q = parent;
  this->target = t;
  this->minVelocity = 0;
  this->maxVelocity = 0;
  this->startDragDistance = 0;
  QEasingCurve::QEasingCurve(&this->scrollingCurve,OutCirc);
  QElapsedTimer::QElapsedTimer(&this->elapsed);
  QPoint::QPoint(&this->pos);
  this->scrollTime = 3000;
  this->xVelocity = 0.0;
  this->yVelocity = 0.0;
  this->mousePressed = false;
  this->maxPause = 300;
  this->scrollAnimation = (QVariantAnimation *)0x0;
  this->distance = 0;
  return;
}

Assistant:

ScrollerPrivate( Scroller * parent, QObject * t )
		:	q( parent )
		,	target( t )
		,	minVelocity( 0 )
		,	maxVelocity( 0 )
		,	startDragDistance( 0 )
		,	scrollingCurve( QEasingCurve::OutCirc )
		,	scrollTime( 3000 )
		,	xVelocity( 0.0 )
		,	yVelocity( 0.0 )
		,	mousePressed( false )
		,	maxPause( 300 )
		,	scrollAnimation( 0 )
		,	distance( 0 )
	{
	}